

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O3

ACODEC_TABLE * find_acodec_table_entry(char *ext)

{
  int iVar1;
  ACODEC_TABLE *pAVar2;
  ulong uVar3;
  
  if (acodec_inited == '\0') {
    acodec_inited = '\x01';
    _al_add_exit_func(acodec_shutdown,"acodec_shutdown");
  }
  if (acodec_table._size != 0) {
    uVar3 = 0;
    do {
      pAVar2 = (ACODEC_TABLE *)_al_vector_ref(&acodec_table,uVar3);
      iVar1 = _al_stricmp(pAVar2,ext);
      if (iVar1 == 0) {
        return pAVar2;
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < acodec_table._size);
  }
  return (ACODEC_TABLE *)0x0;
}

Assistant:

static ACODEC_TABLE *find_acodec_table_entry(const char *ext)
{
   ACODEC_TABLE *ent;
   unsigned i;

   if (!acodec_inited) {
      acodec_inited = true;
      _al_add_exit_func(acodec_shutdown, "acodec_shutdown");
   }

   for (i = 0; i < _al_vector_size(&acodec_table); i++) {
      ent = _al_vector_ref(&acodec_table, i);
      if (0 == _al_stricmp(ent->ext, ext)) {
         return ent;
      }
   }

   return NULL;
}